

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

int __thiscall n_pca::NPca::detector(NPca *this,string *image_path)

{
  char cVar1;
  int iVar2;
  Mat local_d0 [96];
  Mat image;
  
  if (image_path->_M_string_length == 0) {
    puts("couldn\'t find image_path");
    iVar2 = -1;
  }
  else {
    cv::imread((string *)&image,(int)image_path);
    cVar1 = cv::Mat::empty();
    if (cVar1 == '\0') {
      cv::Mat::Mat(local_d0,&image);
      iVar2 = detector(this,local_d0);
      cv::Mat::~Mat(local_d0);
    }
    else {
      puts("open image failde!");
      iVar2 = -1;
    }
    cv::Mat::~Mat(&image);
  }
  return iVar2;
}

Assistant:

int NPca::detector(const std::string image_path)
{
    if (image_path.length() <= 0)
    {
        printf("couldn't find image_path\n");
        return -1;
    }

    Mat image = imread(image_path, IMREAD_GRAYSCALE);

    if (image.empty())
    {
        printf("open image failde!\n");
        return -1;
    }
    return detector(image);
}